

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O1

Scope * slang::analysis::getAsScope(Symbol *symbol)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  
  if (symbol->kind != CheckerInstance) {
    if (symbol->kind != Instance) {
      pSVar1 = (Scope *)(*(code *)(&DAT_0048aec4 + *(int *)(&DAT_0048aec4 + (ulong)symbol->kind * 4)
                                  ))();
      return pSVar1;
    }
    pSVar2 = symbol[1].originatingSyntax;
    if (pSVar2 != (SyntaxNode *)0x0) goto LAB_0037300d;
  }
  pSVar2 = (SyntaxNode *)symbol[1].name._M_str;
LAB_0037300d:
  return (Scope *)&pSVar2[2].previewNode;
}

Assistant:

static const Scope& getAsScope(const Symbol& symbol) {
    switch (symbol.kind) {
        case SymbolKind::Instance: {
            auto& inst = symbol.as<InstanceSymbol>();
            if (auto body = inst.getCanonicalBody())
                return *body;
            return inst.body;
        }
        case SymbolKind::CheckerInstance:
            return symbol.as<CheckerInstanceSymbol>().body;
        default:
            return symbol.as<Scope>();
    }
}